

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall
OpenMD::
AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
::~AndParamConstraint
          (AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
           *this)

{
  LessThanOrEqualToConstraint<double>::~LessThanOrEqualToConstraint
            ((LessThanOrEqualToConstraint<double> *)0x27c74c);
  GreaterThanConstraint<double>::~GreaterThanConstraint((GreaterThanConstraint<double> *)0x27c75a);
  ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>_>
  ::~ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>_>
              *)0x27c764);
  return;
}

Assistant:

AndParamConstraint(Cons1T cons1, Cons2T cons2) :
        cons1_(cons1), cons2_(cons2) {
      std::stringstream iss;
      iss << "(" << cons1_.getConstraintDescription() << " and "
          << cons2_.getConstraintDescription() << ")";
      this->description_ = iss.str();
    }